

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall basisu::vector<basisu::image_stats>::~vector(vector<basisu::image_stats> *this)

{
  if (this->m_p != (image_stats *)0x0) {
    destruct_array<basisu::image_stats>(this->m_p,(ulong)this->m_size);
    free(this->m_p);
    return;
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }